

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O2

void __thiscall covenant::DFA<covenant::Sym>::nondet_union(DFA<covenant::Sym> *this,dfa_t *other)

{
  State SVar1;
  State r;
  pointer pvVar2;
  const_reference cVar3;
  bool bVar4;
  State s;
  ulong uVar5;
  string *this_00;
  pointer pvVar6;
  socklen_t *__addr_len;
  uint uVar7;
  uint uVar8;
  pointer pvVar9;
  int i;
  size_type __n;
  ulong uVar10;
  long lVar11;
  emplace_return eVar12;
  ulong local_98;
  uint local_8c;
  vector<bool,_std::allocator<bool>_> *local_88;
  MapStates mapping;
  string local_50 [32];
  
  if ((((other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_start.super__Bit_iterator_base._M_p !=
        (other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_finish.super__Bit_iterator_base._M_p) ||
      ((other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset != 0)) &&
     (((other->trans).
       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (other->trans).
       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ||
      ((other->eps).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (other->eps).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)))) {
    local_88 = &other->accepts;
    boost::unordered::
    unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::unordered_map(&mapping);
    uVar5 = ((long)(this->trans).
                   super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->trans).
                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    lVar11 = 0;
    uVar10 = uVar5 & 0xffffffff;
    while( true ) {
      pvVar9 = (other->trans).
               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (other->trans).
               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((int)(((long)pvVar6 - (long)pvVar9) / 0x18) <= lVar11) break;
      local_98 = (uVar10 << 0x20) + lVar11;
      boost::unordered::detail::
      table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
      ::emplace_unique<std::pair<int,unsigned_int>>
                ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                  *)&mapping,&local_98,((long)pvVar6 - (long)pvVar9) % 0x18);
      state(this,(int)uVar5 + (int)lVar11);
      uVar10 = (ulong)((int)uVar10 + 1);
      lVar11 = lVar11 + 1;
    }
    uVar8 = 0;
    while( true ) {
      local_98 = CONCAT44(local_98._4_4_,uVar8);
      if ((ulong)(((long)pvVar6 - (long)pvVar9) / 0x18) <= (ulong)uVar8) break;
      for (uVar7 = 0; uVar5 = (ulong)uVar7,
          uVar5 < (ulong)((long)*(pointer *)
                                 ((long)&pvVar9[uVar8].
                                         super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                          *(long *)&pvVar9[uVar8].
                                    super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                    ._M_impl.super__Vector_impl_data >> 3); uVar7 = uVar7 + 1) {
        eVar12 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                 ::try_emplace_unique<unsigned_int_const&>
                           ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                             *)&mapping.table_,(uint *)&local_98);
        SVar1.id = *(uint *)((long)&((eVar12.first.node_.node_)->value_base_).data_.data_ + 4);
        lVar11 = *(long *)&(other->trans).
                           super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_98 & 0xffffffff].
                           super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                           ._M_impl.super__Vector_impl_data;
        eVar12 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                 ::try_emplace_unique<unsigned_int_const&>
                           ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                             *)&mapping.table_,(uint *)(lVar11 + uVar5 * 8 + 4));
        transition(this,SVar1,(Sym *)(lVar11 + uVar5 * 8),
                   (State)*(uint *)((long)&((eVar12.first.node_.node_)->value_base_).data_.data_ + 4
                                   ));
        pvVar9 = (other->trans).
                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (uint)local_98;
      }
      for (uVar7 = 0;
          pvVar2 = (other->eps).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          (ulong)uVar7 <
          (ulong)((long)*(pointer *)
                         ((long)&pvVar2[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data + 8) -
                  *(long *)&pvVar2[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data >> 2); uVar7 = uVar7 + 1) {
        eVar12 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                 ::try_emplace_unique<unsigned_int_const&>
                           ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                             *)&mapping.table_,(uint *)&local_98);
        SVar1.id = *(uint *)((long)&((eVar12.first.node_.node_)->value_base_).data_.data_ + 4);
        local_8c = *(uint *)(*(long *)&(other->eps).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [local_98 & 0xffffffff].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + (ulong)uVar7 * 4);
        eVar12 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                 ::try_emplace_unique<unsigned_int>(&mapping.table_,&local_8c);
        eps_transition(this,SVar1,
                       (State)*(uint *)((long)&((eVar12.first.node_.node_)->value_base_).data_.data_
                                       + 4));
        uVar8 = (uint)local_98;
      }
      uVar8 = uVar8 + 1;
      pvVar9 = (other->trans).
               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (other->trans).
               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    __n = 0;
    while( true ) {
      __addr_len = (socklen_t *)0x18;
      if ((long)(int)(((long)pvVar6 - (long)pvVar9) / 0x18) <= (long)__n) break;
      cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](local_88,__n);
      if (cVar3) {
        local_98 = CONCAT44(local_98._4_4_,(int)__n);
        eVar12 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                 ::try_emplace_unique<unsigned_int>(&mapping.table_,(uint *)&local_98);
        accept(this,*(int *)((long)&((eVar12.first.node_.node_)->value_base_).data_.data_ + 4),
               eVar12._8_8_,__addr_len);
      }
      __n = __n + 1;
      pvVar9 = (other->trans).
               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (other->trans).
               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    s = state(this,(int)(((long)(this->trans).
                                super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->trans).
                               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18));
    SVar1.id = this->start;
    local_98 = CONCAT44(local_98._4_4_,other->start);
    eVar12 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
             ::try_emplace_unique<unsigned_int>(&mapping.table_,(uint *)&local_98);
    r.id = *(uint *)((long)&((eVar12.first.node_.node_)->value_base_).data_.data_ + 4);
    eps_transition(this,s,SVar1);
    eps_transition(this,s,r);
    this->start = s.id;
    eps_elim(this);
    bVar4 = eliminateDeadStates(this);
    if (!bVar4) {
      this_00 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                (local_50,"nondet union of DFA\'s returned an empty automata",(allocator *)&local_98
                );
      std::__cxx11::string::string(this_00,local_50);
      __cxa_throw(this_00,&error::typeinfo,error::~error);
    }
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
    ::~table(&mapping.table_);
  }
  return;
}

Assistant:

void nondet_union(const dfa_t &other)
    { 
      
      if (other.accepts.empty()) 
        return;
      if (other.trans.empty() && other.eps.empty()) 
        return;
      
      MapStates mapping; // mapping to relabel states old -> new
      
      unsigned int nstates = (unsigned int) this->nStates();
      for(int i=0; i< other.nStates(); i++)
      {
        mapping.insert(make_pair(i, nstates));
        this->state(nstates++);
      }
      
      for( unsigned int ss = 0; ss < other.trans.size(); ss++ )
      {
        for( unsigned int ti = 0; ti < other.trans[ss].size(); ti++ )
        {
          this->transition(mkState(mapping[ss]), 
                           other.trans[ss][ti].val,
                           mkState(mapping[other.trans[ss][ti].dest]));
        }
        for(unsigned int ei = 0; ei < other.eps[ss].size(); ei++)
        {
          this->eps_transition(mkState(mapping[ss]), 
                               mkState(mapping[other.eps[ss][ei]])); 
        }
      }
      
      // set new accepting states
      for (int i=0; i < other.nStates() ; i++)
      {
        if (other.accepts[i])
          this->accept(mkState(mapping[i]));
      }
      
      // finally, set new initial state
      State new_start       = this->state(this->nStates());
      State old_start_ndfa  = this->startState();
      State old_start_other = mkState(mapping[other.startState().id]);
      this->eps_transition(new_start, old_start_ndfa);
      this->eps_transition(new_start, old_start_other);
      this->setStart(new_start);
      // Make sure no epsilon transitions after union
      this->eps_elim();    
      bool is_not_empty = this->eliminateDeadStates();
      if (!is_not_empty)
        throw error("nondet union of DFA's returned an empty automata");
    }